

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O1

void to_file(vector<variant_t,_std::allocator<variant_t>_> *output_variants,string *out_path)

{
  pointer pcVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  char cVar6;
  uint uVar7;
  pair<int,_int> pVar8;
  ostream *poVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  char cVar14;
  pointer pvVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  string DNA;
  string snv_type;
  string __str_2;
  string ID;
  variant_t v;
  ofstream out_file;
  char *local_340;
  char *local_338;
  char local_330 [16];
  char *local_320;
  undefined8 local_318;
  char local_310 [16];
  char *local_300;
  uint local_2f8;
  char local_2f0 [16];
  ulong local_2e0;
  char *local_2d8;
  char *local_2d0;
  char local_2c8 [16];
  string local_2b8;
  string local_298;
  undefined1 *local_278;
  ulong local_270;
  undefined1 local_268 [16];
  undefined8 local_258;
  vector<variant_t,_std::allocator<variant_t>_> *local_250;
  undefined8 local_248;
  long local_240;
  pointer local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_250 = output_variants;
  std::ofstream::ofstream(&local_230,(string *)out_path,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "(4/4) Computing edit distances and saving SNPs/indels to file ... ",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  pvVar15 = (local_250->super__Vector_base<variant_t,_std::allocator<variant_t>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_238 = (local_250->super__Vector_base<variant_t,_std::allocator<variant_t>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (pvVar15 != local_238) {
    local_240 = 0;
    local_2e0 = 1;
    local_248 = 0;
    do {
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      pcVar1 = (pvVar15->left_context_0)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,pcVar1,pcVar1 + (pvVar15->left_context_0)._M_string_length);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      pcVar1 = (pvVar15->left_context_1)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar1,pcVar1 + (pvVar15->left_context_1)._M_string_length);
      local_278 = local_268;
      pcVar1 = (pvVar15->right_context)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,pcVar1,pcVar1 + (pvVar15->right_context)._M_string_length);
      local_258._0_4_ = pvVar15->support_0;
      local_258._4_4_ = pvVar15->support_1;
      pVar8 = distance(&local_2b8,&local_298);
      if (pVar8.first <= max_snvs_def) {
        uVar18 = (ulong)pVar8 >> 0x20;
        local_2d8 = local_2c8;
        local_2d0 = (char *)0x0;
        local_2c8[0] = '\0';
        pcVar10 = ">INDEL_higher_path_";
        if (uVar18 == 0) {
          pcVar10 = ">SNP_higher_path_";
        }
        std::__cxx11::string::_M_replace((ulong)&local_2d8,0,(char *)0x0,(ulong)pcVar10);
        cVar14 = '\x01';
        if (9 < local_2e0) {
          uVar11 = local_2e0;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar11 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_00107d2c;
            }
            if (uVar11 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_00107d2c;
            }
            if (uVar11 < 10000) goto LAB_00107d2c;
            bVar2 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar2);
          cVar14 = cVar14 + '\x01';
        }
LAB_00107d2c:
        local_320 = local_310;
        std::__cxx11::string::_M_construct((ulong)&local_320,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_320,(uint)local_318,local_2e0);
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_320);
        if (local_320 != local_310) {
          operator_delete(local_320);
        }
        std::__cxx11::string::append((char *)&local_2d8);
        uVar11 = local_270;
        cVar14 = '\x01';
        if (9 < local_270) {
          uVar12 = local_270;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_00107de4;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_00107de4;
            }
            if (uVar12 < 10000) goto LAB_00107de4;
            bVar2 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar2);
          cVar14 = cVar14 + '\x01';
        }
LAB_00107de4:
        local_320 = local_310;
        std::__cxx11::string::_M_construct((ulong)&local_320,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_320,(uint)local_318,uVar11);
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_320);
        if (local_320 != local_310) {
          operator_delete(local_320);
        }
        std::__cxx11::string::append((char *)&local_2d8);
        local_318 = 0;
        local_310[0] = '\0';
        iVar17 = pVar8.second;
        if (uVar18 == 0) {
          local_320 = local_310;
          std::__cxx11::string::push_back((char)&local_320);
          std::__cxx11::string::append((char *)&local_320);
          std::__cxx11::string::push_back((char)&local_320);
        }
        else if (iVar17 == 0 || (long)pVar8 < 0) {
          local_320 = local_310;
          std::__cxx11::string::append((char *)&local_320);
          std::__cxx11::string::substr((ulong)&local_340,(ulong)&local_298);
          std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_340);
          if (local_340 != local_330) {
            operator_delete(local_340);
          }
        }
        else {
          local_320 = local_310;
          std::__cxx11::string::substr((ulong)&local_340,(ulong)&local_2b8);
          std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_340);
          if (local_340 != local_330) {
            operator_delete(local_340);
          }
          std::__cxx11::string::append((char *)&local_320);
        }
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_320);
        std::__cxx11::string::append((char *)&local_2d8);
        uVar5 = -(uint)local_258;
        if (0 < (int)(uint)local_258) {
          uVar5 = (uint)local_258;
        }
        uVar13 = 1;
        if (9 < uVar5) {
          uVar11 = (ulong)uVar5;
          uVar16 = 4;
          do {
            uVar13 = uVar16;
            uVar7 = (uint)uVar11;
            if (uVar7 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_00107fe7;
            }
            if (uVar7 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_00107fe7;
            }
            if (uVar7 < 10000) goto LAB_00107fe7;
            uVar11 = uVar11 / 10000;
            uVar16 = uVar13 + 4;
          } while (99999 < uVar7);
          uVar13 = uVar13 + 1;
        }
LAB_00107fe7:
        uVar16 = (uint)local_258 >> 0x1f;
        local_340 = local_330;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_340,(char)uVar13 - ((char)((ulong)local_258 >> 0x18) >> 7));
        std::__detail::__to_chars_10_impl<unsigned_int>(local_340 + uVar16,uVar13,uVar5);
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_340);
        if (local_340 != local_330) {
          operator_delete(local_340);
        }
        std::__cxx11::string::append((char *)&local_2d8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_2d8,(long)local_2d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        local_340 = local_330;
        local_338 = (char *)0x0;
        local_330[0] = '\0';
        if ((iVar17 == 0 || (long)pVar8 < 0) && uVar18 != 0) {
          std::__cxx11::string::substr((ulong)&local_300,(ulong)&local_2b8);
          std::__cxx11::string::operator=((string *)&local_340,(string *)&local_300);
          if (local_300 != local_2f0) {
            operator_delete(local_300);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_340);
        }
        std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_278);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_340,(long)local_338);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar10 = ">INDEL_lower_path_";
        if (uVar18 == 0) {
          pcVar10 = ">SNP_lower_path_";
        }
        std::__cxx11::string::_M_replace((ulong)&local_2d8,0,local_2d0,(ulong)pcVar10);
        cVar14 = '\x01';
        if (9 < local_2e0) {
          uVar11 = local_2e0;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar11 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_001081fc;
            }
            if (uVar11 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_001081fc;
            }
            if (uVar11 < 10000) goto LAB_001081fc;
            bVar2 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar2);
          cVar14 = cVar14 + '\x01';
        }
LAB_001081fc:
        local_300 = local_2f0;
        std::__cxx11::string::_M_construct((ulong)&local_300,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_300,local_2f8,local_2e0);
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_300);
        if (local_300 != local_2f0) {
          operator_delete(local_300);
        }
        std::__cxx11::string::append((char *)&local_2d8);
        uVar11 = local_270;
        cVar14 = '\x01';
        if (9 < local_270) {
          uVar12 = local_270;
          cVar6 = '\x04';
          do {
            cVar14 = cVar6;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_001082be;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_001082be;
            }
            if (uVar12 < 10000) goto LAB_001082be;
            bVar2 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar14 + '\x04';
          } while (bVar2);
          cVar14 = cVar14 + '\x01';
        }
LAB_001082be:
        local_300 = local_2f0;
        std::__cxx11::string::_M_construct((ulong)&local_300,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_300,local_2f8,uVar11);
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_300);
        if (local_300 != local_2f0) {
          operator_delete(local_300);
        }
        std::__cxx11::string::append((char *)&local_2d8);
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_320);
        std::__cxx11::string::append((char *)&local_2d8);
        uVar5 = -local_258._4_4_;
        if (0 < (int)local_258._4_4_) {
          uVar5 = local_258._4_4_;
        }
        uVar13 = 1;
        if (9 < uVar5) {
          uVar11 = (ulong)uVar5;
          uVar16 = 4;
          do {
            uVar13 = uVar16;
            uVar7 = (uint)uVar11;
            if (uVar7 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_00108399;
            }
            if (uVar7 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_00108399;
            }
            if (uVar7 < 10000) goto LAB_00108399;
            uVar11 = uVar11 / 10000;
            uVar16 = uVar13 + 4;
          } while (99999 < uVar7);
          uVar13 = uVar13 + 1;
        }
LAB_00108399:
        uVar16 = local_258._4_4_ >> 0x1f;
        local_300 = local_2f0;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_300,(char)uVar13 - (char)((long)local_258 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_int>(local_300 + uVar16,uVar13,uVar5);
        std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_300);
        if (local_300 != local_2f0) {
          operator_delete(local_300);
        }
        std::__cxx11::string::append((char *)&local_2d8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_2d8,(long)local_2d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__cxx11::string::_M_replace((ulong)&local_340,0,local_338,0x10dad8);
        if ((iVar17 == 0 || (long)pVar8 < 0) || uVar18 == 0) {
          std::__cxx11::string::_M_assign((string *)&local_340);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_300,(ulong)&local_298);
          std::__cxx11::string::operator=((string *)&local_340,(string *)&local_300);
          if (local_300 != local_2f0) {
            operator_delete(local_300);
          }
        }
        std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_278);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_340,(long)local_338);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if (local_340 != local_330) {
          operator_delete(local_340);
        }
        if (local_320 != local_310) {
          operator_delete(local_320);
        }
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8);
        }
        local_2e0 = local_2e0 + 1;
      }
      local_240 = local_240 + 1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = ((long)(local_250->super__Vector_base<variant_t,_std::allocator<variant_t>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_250->super__Vector_base<variant_t,_std::allocator<variant_t>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_240 * 100;
      iVar17 = SUB164(auVar4 / auVar3,0);
      if ((int)local_248 + 10 <= iVar17) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"% done.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        local_248 = SUB168(auVar4 / auVar3,0);
      }
      if (local_278 != local_268) {
        operator_delete(local_278);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      pvVar15 = pvVar15 + 1;
    } while (pvVar15 != local_238);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void to_file(vector<variant_t> & output_variants, string & out_path){

	ofstream out_file = ofstream(out_path);

	uint64_t id_nr = 1;
	uint64_t idx = 0;

	int perc = 0;
	int last_perc = 0;

	cout << "(4/4) Computing edit distances and saving SNPs/indels to file ... " << endl;
	for(auto v:output_variants){

		auto d = distance(v.left_context_0,v.left_context_1);

		if(d.first <= max_snvs_def){

			/*
			 * sample 1
			 */

			string ID;

			if(d.second != 0){

				ID =  ">INDEL_higher_path_";

			}else{

				ID =  ">SNP_higher_path_";

			}

			ID.append(to_string(id_nr));
			ID.append("|P_1:");
			ID.append(to_string(v.right_context.size()));
			ID.append("_");

			string snv_type;

			if(d.second==0){

				snv_type += v.left_context_0[v.left_context_0.size()-1];
				snv_type.append("/");
				snv_type += v.left_context_1[v.left_context_1.size()-1];

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				snv_type.append(v.left_context_0.substr(v.left_context_0.size()-d.second));
				snv_type.append("/");

			}else{//insert of length -d.second in v.left_context_1

				snv_type.append("/");
				snv_type.append(v.left_context_1.substr(v.left_context_1.size() - (-d.second)));

			}

			ID.append(snv_type);
			ID.append("|");
			ID.append(std::to_string(v.support_0));//we write the number of reads supporting this variant
			//ID.append("high");
			ID.append("|nb_pol_1");

			out_file << ID << endl;

			string DNA;

			if(d.second==0){

				DNA = v.left_context_0;

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				DNA = v.left_context_0;

			}else{//insert of length -d.second in v.left_context_1

				DNA = v.left_context_0.substr(-d.second);

			}

			DNA.append(v.right_context);

			out_file << DNA << endl;

			/*
			 * sample 2
			 */

			if(d.second != 0){

				ID =  ">INDEL_lower_path_";

			}else{

				ID =  ">SNP_lower_path_";

			}

			ID.append(to_string(id_nr));
			ID.append("|P_1:");
			ID.append(to_string(v.right_context.size()));
			ID.append("_");
			ID.append(snv_type);
			ID.append("|");
			ID.append(std::to_string(v.support_1));
			//ID.append("high");
			ID.append("|nb_pol_1");

			out_file << ID << endl;

			DNA = "";

			if(d.second==0){

				DNA = v.left_context_1;

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				DNA = v.left_context_1.substr(d.second);

			}else{//insert of length -d.second in v.left_context_1

				DNA = v.left_context_1;

			}

			DNA.append(v.right_context);
			out_file << DNA << endl;

			id_nr++;

		}

		idx++;

		perc = (idx*100)/output_variants.size();
		if(perc >= last_perc+10){

			last_perc=perc;
			cout << " " << perc << "% done." << endl;

		}

	}

}